

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_resetWithMath_Test::TestBody(Clone_resetWithMath_Test *this)

{
  element_type *peVar1;
  allocator<char> local_39;
  ResetPtr r;
  ResetPtr rClone;
  
  libcellml::Reset::create();
  peVar1 = r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&rClone,"unique",&local_39);
  libcellml::Entity::setId((string *)peVar1);
  std::__cxx11::string::~string((string *)&rClone);
  libcellml::Reset::setOrder
            ((int)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Reset::setTestValue
            ((string *)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Reset::setResetValue
            ((string *)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Reset::clone();
  compareReset((shared_ptr *)&r,(shared_ptr *)&rClone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rClone.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Clone, resetWithMath)
{
    auto r = libcellml::Reset::create();
    r->setId("unique");
    r->setOrder(32);
    r->setTestValue(NON_EMPTY_MATH);
    r->setResetValue(EMPTY_MATH);

    auto rClone = r->clone();

    compareReset(r, rClone);
}